

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O0

vector<Testdata,_std::allocator<Testdata>_> *
ReadDataFiles(vector<Testdata,_std::allocator<Testdata>_> *__return_storage_ptr__,char *testdata_dir
             )

{
  bool bVar1;
  iterator __first;
  reference pbVar2;
  reference pvVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  size_type sVar7;
  reference s;
  string local_1f8 [36];
  int local_1d4;
  char *pcStack_1d0;
  int dictnum;
  char *dictnum_pos;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [32];
  Testdata local_178;
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [8];
  string fname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *new_output;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  const_iterator it;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  namelist;
  char *testdata_dir_local;
  vector<Testdata,_std::allocator<Testdata>_> *retval;
  
  namelist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<Testdata,_std::allocator<Testdata>_>::vector(__return_storage_ptr__);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  GetNamelist(testdata_dir,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_38);
  __first = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_38);
  it._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )it._M_current);
  local_68._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_60,&local_68);
  do {
    new_output = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_38);
    bVar1 = __gnu_cxx::operator!=
                      (&local_60,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&new_output);
    if (!bVar1) {
      namelist.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38);
      if ((namelist.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        std::vector<Testdata,_std::allocator<Testdata>_>::~vector(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    local_78 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,testdata_dir,&local_d9);
    std::operator+(local_b8,(char *)local_d8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_60);
    std::__cxx11::string::c_str();
    std::operator+(local_98,(char *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,".in",&local_101);
    bVar1 = EndsWith(local_98,(string *)local_100);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    if (bVar1) {
      local_178.annotated_output.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_178.annotated_output.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_178.output.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_178.annotated_output.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.output.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.output.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_178._48_8_ = 0;
      local_178._56_8_ = 0;
      local_178.input_template = (string)0x0;
      local_178._33_7_ = 0;
      local_178._40_8_ = 0;
      local_178._16_8_ = 0;
      local_178._24_8_ = 0;
      local_178.input_template_name = (string)0x0;
      local_178._1_7_ = 0;
      local_178._8_8_ = 0;
      Testdata::Testdata(&local_178);
      std::vector<Testdata,_std::allocator<Testdata>_>::push_back(__return_storage_ptr__,&local_178)
      ;
      Testdata::~Testdata(&local_178);
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_60);
      pvVar3 = std::vector<Testdata,_std::allocator<Testdata>_>::back(__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)pvVar3,(string *)pbVar2);
      pvVar3 = std::vector<Testdata,_std::allocator<Testdata>_>::back(__return_storage_ptr__);
      ReadToString(local_98,&pvVar3->input_template);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_198,".out",&local_199);
      bVar1 = EndsWith(local_98,(string *)local_198);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      if (bVar1) {
        pvVar3 = std::vector<Testdata,_std::allocator<Testdata>_>::back(__return_storage_ptr__);
        local_78 = &pvVar3->output;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c0,".anno_out",(allocator *)((long)&dictnum_pos + 7));
        bVar1 = EndsWith(local_98,(string *)local_1c0);
        std::__cxx11::string::~string(local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&dictnum_pos + 7));
        if (!bVar1) {
          printf("%s: %d: ASSERT FAILED: %s\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                 ,199,"false");
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                        ,199,"vector<Testdata> ReadDataFiles(const char *)");
        }
        pvVar3 = std::vector<Testdata,_std::allocator<Testdata>_>::back(__return_storage_ptr__);
        local_78 = &pvVar3->annotated_output;
      }
    }
    if (local_78 !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      bVar1 = std::vector<Testdata,_std::allocator<Testdata>_>::empty(__return_storage_ptr__);
      if (bVar1) {
        printf("%s: %d: ASSERT FAILED: %s\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
               ,0xca,"!retval.empty()");
        bVar1 = std::vector<Testdata,_std::allocator<Testdata>_>::empty(__return_storage_ptr__);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          exit(1);
        }
        __assert_fail("!retval.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                      ,0xca,"vector<Testdata> ReadDataFiles(const char *)");
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_60);
      uVar4 = std::__cxx11::string::length();
      std::vector<Testdata,_std::allocator<Testdata>_>::back(__return_storage_ptr__);
      lVar5 = std::__cxx11::string::length();
      if (uVar4 <= lVar5 + 4U) {
        printf("%s: %d: ASSERT FAILED: %s\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
               ,0xcb,"it->length() > retval.back().input_template_name.length() + 4");
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_60);
        uVar4 = std::__cxx11::string::length();
        std::vector<Testdata,_std::allocator<Testdata>_>::back(__return_storage_ptr__);
        lVar5 = std::__cxx11::string::length();
        if (uVar4 <= lVar5 + 4U) {
          __assert_fail("it->length() > retval.back().input_template_name.length() + 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                        ,0xcb,"vector<Testdata> ReadDataFiles(const char *)");
        }
        exit(1);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_60);
      lVar5 = std::__cxx11::string::c_str();
      std::vector<Testdata,_std::allocator<Testdata>_>::back(__return_storage_ptr__);
      lVar6 = std::__cxx11::string::length();
      pcStack_1d0 = (char *)(lVar5 + 2 + lVar6);
      local_1d4 = atoi32(pcStack_1d0);
      if (local_1d4 == 0) {
        printf("%s: %d: ASSERT FAILED: %s\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
               ,0xd0,"dictnum");
        if (local_1d4 == 0) {
          __assert_fail("dictnum",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                        ,0xd0,"vector<Testdata> ReadDataFiles(const char *)");
        }
        exit(1);
      }
      while (sVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size(local_78), sVar7 < (ulong)(long)local_1d4) {
        std::__cxx11::string::string(local_1f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_78,(value_type *)local_1f8);
        std::__cxx11::string::~string(local_1f8);
      }
      s = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_78,(long)(local_1d4 + -1));
      ReadToString(local_98,s);
    }
    std::__cxx11::string::~string((string *)local_98);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_60);
  } while( true );
}

Assistant:

static vector<Testdata> ReadDataFiles(const char* testdata_dir) {
  vector<Testdata> retval;
  vector<string> namelist;

  GetNamelist(testdata_dir, &namelist);
  sort(namelist.begin(), namelist.end());

  for (vector<string>::const_iterator it = namelist.begin();
       it != namelist.end(); ++it) {
    vector<string>* new_output = NULL;
    const string fname = string(testdata_dir) + "/" + it->c_str();
    if (EndsWith(fname, ".in")) {
      retval.push_back(Testdata());
      retval.back().input_template_name = *it;
      ReadToString(fname, &retval.back().input_template);
    } else if (EndsWith(fname, ".out")) {
      new_output = &retval.back().output;
    } else if (EndsWith(fname, ".anno_out")) {
      new_output = &retval.back().annotated_output;
    } else {
      ASSERT(false);  // Filename must end in either .in, .out, or .anno_out.
    }
    if (new_output) {            // the .out and .anno_out cases
      ASSERT(!retval.empty());   // an .out without any corresponding .in?
      ASSERT(it->length() > retval.back().input_template_name.length() + 4);
      // input file is foo.in, and output is foo_dictYY.out.  This gets to YY.
      const char* dictnum_pos = (it->c_str() +
                                 retval.back().input_template_name.length() + 2);
      int dictnum = atoi32(dictnum_pos);   // just ignore chars after the YY
      ASSERT(dictnum);                   // dictnums should start with 01
      while (new_output->size() <
             static_cast<vector<string>::size_type>(dictnum))
        new_output->push_back(string());
      ReadToString(fname, &((*new_output)[dictnum-1]));
    }
  }
  return retval;
}